

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int num4bf;
  int i;
  char *in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000044;
  int *in_stack_00000048;
  int in_stack_00000050;
  int in_stack_00000054;
  int local_14;
  
  if (1 < in_EDI) {
    for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
      iVar1 = strcasecmp(*(char **)(in_RSI + (long)local_14 * 8),"-yuv");
      if (iVar1 == 0) {
        doYUV = 1;
      }
      else {
        iVar1 = strcasecmp(*(char **)(in_RSI + (long)local_14 * 8),"-noyuvpad");
        if (iVar1 == 0) {
          pad = 1;
        }
        else {
          iVar1 = strcasecmp(*(char **)(in_RSI + (long)local_14 * 8),"-alloc");
          if (iVar1 == 0) {
            alloc = 1;
          }
          else {
            iVar1 = strcasecmp(*(char **)(in_RSI + (long)local_14 * 8),"-bmp");
            if (iVar1 == 0) {
              iVar1 = bmpTest();
              return iVar1;
            }
            usage((char *)0x1064ab);
          }
        }
      }
    }
  }
  if (alloc != 0) {
    printf("Testing automatic buffer allocation\n");
  }
  overflowTest();
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040,
         in_stack_00000038);
  bufSizeTest();
  if (doYUV != 0) {
    printf("\n--------------------\n\n");
    doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040
           ,in_stack_00000038);
    doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040
           ,in_stack_00000038);
    doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040
           ,in_stack_00000038);
    doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040
           ,in_stack_00000038);
    doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040
           ,in_stack_00000038);
    doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040
           ,in_stack_00000038);
    doTest(in_stack_00000054,in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040
           ,in_stack_00000038);
  }
  return exitStatus;
}

Assistant:

int main(int argc, char *argv[])
{
  int i, num4bf = 5;

#ifdef _WIN32
  srand((unsigned int)time(NULL));
#endif
  if (argc > 1) {
    for (i = 1; i < argc; i++) {
      if (!strcasecmp(argv[i], "-yuv")) doYUV = 1;
      else if (!strcasecmp(argv[i], "-noyuvpad")) pad = 1;
      else if (!strcasecmp(argv[i], "-alloc")) alloc = 1;
      else if (!strcasecmp(argv[i], "-bmp")) return bmpTest();
      else usage(argv[0]);
    }
  }
  if (alloc) printf("Testing automatic buffer allocation\n");
  if (doYUV) num4bf = 4;
  overflowTest();
  doTest(35, 39, _3byteFormats, 2, TJSAMP_444, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_444, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_422, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_422, "test");
  doTest(39, 41, _3byteFormats, 2, TJSAMP_420, "test");
  doTest(41, 35, _4byteFormats, num4bf, TJSAMP_420, "test");
  doTest(35, 39, _3byteFormats, 2, TJSAMP_440, "test");
  doTest(39, 41, _4byteFormats, num4bf, TJSAMP_440, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_411, "test");
  doTest(35, 39, _4byteFormats, num4bf, TJSAMP_411, "test");
  doTest(39, 41, _onlyGray, 1, TJSAMP_GRAY, "test");
  doTest(41, 35, _3byteFormats, 2, TJSAMP_GRAY, "test");
  doTest(35, 39, _4byteFormats, 4, TJSAMP_GRAY, "test");
  bufSizeTest();
  if (doYUV) {
    printf("\n--------------------\n\n");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_444, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_422, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_420, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_440, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_411, "test_yuv0");
    doTest(48, 48, _onlyRGB, 1, TJSAMP_GRAY, "test_yuv0");
    doTest(48, 48, _onlyGray, 1, TJSAMP_GRAY, "test_yuv0");
  }

  return exitStatus;
}